

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeInternalTestLarge::PreEncodeFrameHook
          (ResizeInternalTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  uint uVar2;
  long *in_RSI;
  long in_RDI;
  aom_scaling_mode mode_3;
  aom_scaling_mode mode_2;
  aom_scaling_mode mode_1;
  aom_scaling_mode mode;
  int new_q;
  undefined1 local_3c [8];
  undefined8 local_34;
  undefined1 local_2c [8];
  undefined8 local_24;
  undefined4 local_1c;
  long *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x418) & 1) == 0) {
    uVar2 = (**(code **)(*in_RSI + 0x40))();
    if ((2 < uVar2) && (uVar2 = (**(code **)(*local_10 + 0x40))(), uVar2 < 6)) {
      local_34 = 0x200000001;
      libaom_test::Encoder::Control(encoder,new_q,stack0x00000020);
    }
    uVar2 = (**(code **)(*local_10 + 0x40))();
    if (5 < uVar2) {
      memset(local_3c,0,8);
      libaom_test::Encoder::Control(encoder,new_q,stack0x00000020);
    }
  }
  else {
    local_1c = 0x3c;
    iVar1 = (**(code **)(*in_RSI + 0x40))();
    if (iVar1 == 0) {
      local_24 = 0x600000006;
      libaom_test::Encoder::Control(encoder,new_q,stack0x00000020);
    }
    else {
      iVar1 = (**(code **)(*local_10 + 0x40))();
      if (iVar1 == 1) {
        memset(local_2c,0,8);
        libaom_test::Encoder::Control(encoder,new_q,stack0x00000020);
        *(undefined4 *)(in_RDI + 0xc0) = local_1c;
        *(undefined4 *)(in_RDI + 0xbc) = local_1c;
        libaom_test::Encoder::Config
                  (encoder,(aom_codec_enc_cfg_t *)CONCAT44(new_q,mode.v_scaling_mode));
      }
    }
  }
  return;
}

Assistant:

void PreEncodeFrameHook(libaom_test::VideoSource *video,
                          libaom_test::Encoder *encoder) override {
    if (change_config_) {
      int new_q = 60;
      if (video->frame() == 0) {
        struct aom_scaling_mode mode = { AOME_ONETWO, AOME_ONETWO };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      } else if (video->frame() == 1) {
        struct aom_scaling_mode mode = { AOME_NORMAL, AOME_NORMAL };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
        cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = new_q;
        encoder->Config(&cfg_);
      }
    } else {
      if (video->frame() >= kStepDownFrame && video->frame() < kStepUpFrame) {
        struct aom_scaling_mode mode = { AOME_FOURFIVE, AOME_THREEFIVE };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      }
      if (video->frame() >= kStepUpFrame) {
        struct aom_scaling_mode mode = { AOME_NORMAL, AOME_NORMAL };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      }
    }
  }